

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CNegativeBufferMappedElements<glcts::(anonymous_namespace)::test_api::GL>::
Run(CNegativeBufferMappedElements<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  undefined1 auVar1 [16];
  GLboolean GVar2;
  GLuint GVar3;
  GLenum GVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_type __n;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  CColorArray coords;
  CElementArray elements;
  CColorArray bufferTest;
  CColorArray bufferRef;
  DIResult result;
  allocator_type local_539;
  string local_538;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_510;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4f8;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined8 local_4d4;
  undefined4 local_4cc;
  value_type local_4c8;
  undefined1 local_4b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [23];
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [23];
  long local_1b8;
  DILogger local_1b0;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  local_4b8._0_8_ = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,0x1af8059);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar3 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_338,(string *)local_4b8,
                     &local_538,true);
  this->_program = GVar3;
  if (local_538._M_dataplus._M_p != (pointer)((long)&local_538 + 0x10)) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._0_8_ != local_4a8) {
    operator_delete((void *)local_4b8._0_8_,local_4a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_338._4_4_,local_338._0_4_) != local_328) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_338._4_4_,local_338._0_4_),
                    local_328[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar8 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_538._M_dataplus._M_p = (pointer)0x0;
    local_538._M_string_length = 0;
    local_538.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_538);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_538._M_string_length - (long)local_538._M_dataplus._M_p,
               local_538._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_4cc = 0;
    local_4d4 = 0;
    __n = (long)(local_538._M_string_length - (long)local_538._M_dataplus._M_p) >> 4;
    local_4dc = (undefined4)__n;
    local_4d8 = 1;
    local_338._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_510,__n,(value_type_conflict4 *)local_338,(allocator_type *)local_4b8);
    auVar1 = _DAT_019f5ce0;
    if ((long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar8 = (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar9 = lVar8 + -1;
      auVar11._8_4_ = (int)lVar9;
      auVar11._0_8_ = lVar9;
      auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar11 = auVar11 ^ _DAT_019f5ce0;
      auVar12 = _DAT_019fcc00;
      do {
        auVar13 = auVar12 ^ auVar1;
        if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                    auVar11._4_4_ < auVar13._4_4_) & 1)) {
          local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = (uint)uVar10;
        }
        if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
            auVar13._12_4_ <= auVar11._12_4_) {
          local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10 + 1] = (uint)uVar10 + 1;
        }
        uVar10 = uVar10 + 2;
        lVar9 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar9 + 2;
      } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar10);
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_4dc,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,
               (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    local_338._0_4_ = local_338._0_4_ & 0xffffff00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
    local_1b8 = 0;
    pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,0x14,2);
    if (pvVar7 == (void *)0x0) {
      local_1b8 = -1;
      local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b8 + 8));
      if (local_4b8[0] == (string)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b8 + 8),
                   "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL",0x44);
      }
      DILogger::~DILogger((DILogger *)local_4b8);
    }
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
    GVar4 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar4 != 0) {
      if (GVar4 == 0x502) {
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        iVar5 = *(int *)CONCAT44(extraout_var,iVar5);
        iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ = (float  [4])0x0;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   local_4b8,(long)(iVar5 * *(int *)(CONCAT44(extraout_var_00,iVar6) + 4)),
                   (value_type *)&local_4f8,(allocator_type *)&local_4c8);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        iVar5 = *(int *)CONCAT44(extraout_var_01,iVar5);
        iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        local_4c8.m_data[0] = 1.0;
        local_4c8.m_data[1] = 1.0;
        local_4c8.m_data[2] = 1.0;
        local_4c8.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&local_4f8,(long)(iVar5 * *(int *)(CONCAT44(extraout_var_02,iVar6) + 4)),
                   &local_4c8,&local_539);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        width = *(GLsizei *)CONCAT44(extraout_var_03,iVar5);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        glu::CallLogWrapper::glReadPixels
                  (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_04,iVar5) + 4),0x1908,0x1406
                   ,local_4f8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        widthTest = *(uint *)CONCAT44(extraout_var_05,iVar5);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar5) + 4);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        widthRef = *(uint *)CONCAT44(extraout_var_07,iVar5);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                          ((DrawIndirectBase *)
                           ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                           m_context)->m_renderCtx,&local_4f8,widthTest,heightTest,
                           (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_4b8,widthRef,*(uint *)(CONCAT44(extraout_var_08,iVar5) + 4));
        DIResult::sub_result(&local_1b0,(DIResult *)local_338,lVar8);
        DILogger::~DILogger(&local_1b0);
        if (local_4f8.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_4f8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4f8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_4b8._0_8_,
                          local_4a8[0]._M_allocated_capacity - local_4b8._0_8_);
        }
      }
      else {
        local_1b8 = -1;
        local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b8 + 8));
        if (local_4b8[0] == (string)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4b8 + 8),"Invalid error code returned by a driver",0x27);
        }
        DILogger::~DILogger((DILogger *)local_4b8);
      }
    }
    if (pvVar7 != (void *)0x0) {
      GVar2 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
      if (GVar2 != '\x01') {
        local_1b8 = -1;
        local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b8 + 8));
        if (local_4b8[0] == (string)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4b8 + 8),
                     "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",
                     0x4a);
        }
        DILogger::~DILogger((DILogger *)local_4b8);
      }
    }
    lVar8 = local_1b8;
    DILogger::~DILogger((DILogger *)local_338);
    if (local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_510.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_510.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_538._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_538._M_dataplus._M_p,
                      local_538.field_2._M_allocated_capacity - (long)local_538._M_dataplus._M_p);
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords.size());
		indirectElements.primCount					 = 1;

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		DIResult result;
		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawElementsIndirectCommand), GL_MAP_WRITE_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);

		GLenum error = glGetError();
		if (error == GL_INVALID_OPERATION)
		{
			//GL error: nothing is rendered
			CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
			CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

			ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
			result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef,
											 getWindowWidth(), getWindowHeight()));
		}
		else if (error == GL_NO_ERROR)
		{
			//No GL error: undefined
		}
		else
		{
			result.error() << "Invalid error code returned by a driver";
		}

		if (buf)
		{
			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) != GL_TRUE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;
		}

		return result.code();
	}